

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passkey.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  llama_token *plVar1;
  float *pfVar2;
  llama_pos *plVar3;
  int32_t *piVar4;
  llama_seq_id **pplVar5;
  uint uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  byte bVar11;
  int iVar12;
  undefined8 uVar13;
  common_log *pcVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  size_type sVar17;
  uint *puVar18;
  long lVar19;
  float fVar20;
  int64_t t_main_end;
  llama_token new_token_id;
  int64_t t_main_start;
  int n_decode;
  int n_cur;
  int n_discard_1;
  int j_1;
  int n_discard;
  int i_2;
  int j;
  int bd;
  int ib;
  int i_1;
  int n_past;
  llama_batch batch;
  int n_batch_grp;
  int n_batch;
  int n_kv_req;
  int n_ctx;
  int n_len;
  int n_predict;
  int n_tokens_all;
  int n_tokens_prefix;
  vector<int,_std::allocator<int>_> tokens_list;
  llama_sampler *smpl;
  llama_sampler_chain_params sparams;
  llama_context *ctx;
  llama_context_params ctx_params;
  llama_vocab *vocab;
  llama_model *model;
  llama_model_params model_params;
  int i;
  int passkey;
  string prompt_suffix;
  string prompt_prefix;
  int i_pos;
  int n_grp;
  int n_keep;
  int n_junk;
  common_params params;
  undefined4 in_stack_ffffffffffffe4e0;
  undefined4 in_stack_ffffffffffffe4e4;
  undefined4 in_stack_ffffffffffffe4e8;
  undefined4 uVar21;
  undefined4 in_stack_ffffffffffffe4ec;
  undefined1 logits;
  undefined4 uVar22;
  undefined2 uVar23;
  undefined1 parse_special;
  undefined1 add_special;
  llama_context *__a;
  undefined4 in_stack_ffffffffffffe510;
  undefined4 in_stack_ffffffffffffe514;
  undefined4 uVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe518;
  iterator piVar25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe520;
  undefined8 in_stack_ffffffffffffe528;
  common_params *in_stack_ffffffffffffe700;
  undefined4 uStack_18d0;
  undefined4 uStack_18cc;
  int iStack_18c0;
  llama_token lStack_18bc;
  undefined4 uStack_1890;
  undefined4 uStack_188c;
  undefined4 uStack_1884;
  int iStack_1880;
  llama_token lStack_187c;
  llama_pos local_1878;
  undefined4 uStack_1870;
  undefined4 uStack_186c;
  undefined4 local_1854;
  undefined4 *local_1850;
  undefined8 local_1848;
  string local_1828 [36];
  undefined4 local_1804;
  long local_1800;
  int local_17f8;
  uint local_17f4;
  uint local_17f0;
  int local_17ec [3];
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  int32_t *local_17c8;
  undefined8 uStack_17c0;
  llama_context *local_17b8;
  undefined4 local_17a4;
  undefined4 *local_17a0;
  undefined8 local_1798;
  int local_1778;
  uint local_1774;
  uint local_1770;
  int local_176c [3];
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  int32_t *local_1748;
  undefined8 uStack_1740;
  llama_context *local_1738;
  undefined4 local_172c;
  undefined4 *local_1728;
  undefined8 local_1720;
  int local_16fc;
  int local_16f8;
  int local_16f4;
  uint local_16f0;
  int local_16ec;
  llama_batch local_16e8;
  uint local_16ac;
  uint local_16a8;
  undefined4 local_16a4;
  uint local_16a0;
  uint local_169c;
  undefined4 local_1698;
  uint local_1694;
  vector<int,_std::allocator<int>_> local_1690;
  uint local_1674;
  vector<int,_std::allocator<int>_> local_1658;
  undefined1 local_1639;
  undefined8 local_1638;
  undefined1 local_1629;
  undefined8 local_1628;
  undefined8 uStack_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  llama_context *local_15f8;
  undefined8 uStack_15f0;
  iterator local_15e8;
  size_type sStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  long local_15b0;
  int local_15a8;
  uint uStack_15a4;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  llama_context *local_1578;
  undefined8 uStack_1570;
  iterator local_1568;
  size_type sStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  undefined8 local_1530;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  long local_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  string local_1490 [32];
  string local_1470 [32];
  string local_1450 [32];
  string local_1430 [32];
  string local_1410 [32];
  string local_13f0 [36];
  int local_13cc;
  uint local_13c8;
  allocator<char> local_13c1;
  string local_13c0 [39];
  allocator<char> local_1399;
  string local_1398 [32];
  int local_1378;
  uint local_1374;
  int local_1370;
  int local_136c;
  undefined4 local_1368;
  undefined4 local_1350;
  int local_1348;
  uint local_1338;
  undefined4 local_ca8;
  _func_void_int_char_ptr_ptr *in_stack_fffffffffffff870;
  llama_example in_stack_fffffffffffff87c;
  common_params *in_stack_fffffffffffff880;
  char **in_stack_fffffffffffff888;
  int in_stack_fffffffffffff890;
  string local_538 [1176];
  int local_a0;
  int local_9c;
  int local_4;
  
  local_4 = 0;
  common_params::common_params(in_stack_ffffffffffffe700);
  local_a0 = 0xfa;
  local_1348 = 0x20;
  local_9c = -1;
  bVar10 = common_params_parse(in_stack_fffffffffffff890,in_stack_fffffffffffff888,
                               in_stack_fffffffffffff880,in_stack_fffffffffffff87c,
                               in_stack_fffffffffffff870);
  if (bVar10) {
    common_init();
    local_136c = local_a0;
    local_1370 = local_1348;
    local_1374 = local_1338;
    local_1378 = local_9c;
    if (local_9c == -1) {
      local_1378 = rand();
      local_1378 = local_1378 % local_136c;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe520,(char *)in_stack_ffffffffffffe518,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffe514,in_stack_ffffffffffffe510));
    std::allocator<char>::~allocator(&local_1399);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe520,(char *)in_stack_ffffffffffffe518,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffe514,in_stack_ffffffffffffe510));
    std::allocator<char>::~allocator(&local_13c1);
    std::__cxx11::string::operator=(local_538,local_1398);
    iVar12 = rand();
    local_13c8 = iVar12 % 50000 + 1;
    for (local_13cc = 0; local_13cc < local_136c; local_13cc = local_13cc + 1) {
      if (local_13cc % local_136c == local_1378) {
        std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffe528 >> 0x20));
        std::operator+((char *)CONCAT44(in_stack_ffffffffffffe4ec,in_stack_ffffffffffffe4e8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffe4e4,in_stack_ffffffffffffe4e0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffe4ec,in_stack_ffffffffffffe4e8),
                       (char *)CONCAT44(in_stack_ffffffffffffe4e4,in_stack_ffffffffffffe4e0));
        std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffe528 >> 0x20));
        std::operator+(in_stack_ffffffffffffe518,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffe514,in_stack_ffffffffffffe510));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffe4ec,in_stack_ffffffffffffe4e8),
                       (char *)CONCAT44(in_stack_ffffffffffffe4e4,in_stack_ffffffffffffe4e0));
        std::__cxx11::string::operator+=(local_538,local_13f0);
        std::__cxx11::string::~string(local_13f0);
        std::__cxx11::string::~string(local_1410);
        std::__cxx11::string::~string(local_1490);
        std::__cxx11::string::~string(local_1430);
        std::__cxx11::string::~string(local_1450);
        std::__cxx11::string::~string(local_1470);
      }
      std::__cxx11::string::operator+=
                (local_538,
                 " The grass is green. The sky is blue. The sun is yellow. Here we go. There and back again."
                );
    }
    std::__cxx11::string::operator+=(local_538,local_13c0);
    llama_backend_init();
    llama_numa_init(local_ca8);
    common_model_params_to_llama
              ((common_params *)CONCAT44(in_stack_ffffffffffffe4e4,in_stack_ffffffffffffe4e0));
    uVar13 = std::__cxx11::string::c_str();
    local_14e8 = local_1498;
    local_14f8 = local_14a8;
    uStack_14f0 = uStack_14a0;
    local_1508 = local_14b8;
    uStack_1500 = uStack_14b0;
    local_1518 = local_14c8;
    uStack_1510 = uStack_14c0;
    uVar16 = uStack_1510;
    local_1528 = local_14d8;
    uStack_1520 = uStack_14d0;
    uVar15 = uStack_1520;
    uStack_1520._0_4_ = (undefined4)uStack_14d0;
    uStack_1520._4_4_ = (undefined4)((ulong)uStack_14d0 >> 0x20);
    uStack_1510._0_4_ = (undefined4)uStack_14c0;
    uStack_1510._4_4_ = (undefined4)((ulong)uStack_14c0 >> 0x20);
    uStack_18d0 = (undefined4)uStack_1520;
    uStack_18cc = uStack_1520._4_4_;
    uVar21 = (undefined4)uStack_1510;
    uVar22 = uStack_1510._4_4_;
    uStack_1520 = uVar15;
    uStack_1510 = uVar16;
    local_14e0 = llama_model_load_from_file(uVar13);
    if (local_14e0 == 0) {
      if (-1 < common_log_verbosity_thold) {
        pcVar14 = common_log_main();
        common_log_add(pcVar14,GGML_LOG_LEVEL_ERROR,"%s: unable to load model\n","main");
      }
      local_4 = 1;
      local_1368 = 1;
    }
    else {
      local_1530 = llama_model_get_vocab(local_14e0);
      common_context_params_to_llama((common_params *)CONCAT44(uVar22,uVar21));
      iVar12 = llama_model_n_ctx_train(local_14e0);
      local_15a8 = iVar12 * local_1374 + local_1370;
      if (uStack_15a4 % local_1374 != 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/passkey/passkey.cpp"
                   ,0x52,"GGML_ASSERT(%s) failed",
                   "ctx_params.n_batch % n_grp == 0 && \"n_batch must be divisible by n_grp\"");
      }
      local_15b8 = local_1538;
      local_15c8 = local_1548;
      uStack_15c0 = uStack_1540;
      local_15d8 = local_1558;
      uStack_15d0 = uStack_1550;
      local_15e8 = local_1568;
      sStack_15e0 = sStack_1560;
      local_1628 = CONCAT44(uStack_15a4,local_15a8);
      local_15f8 = local_1578;
      uStack_15f0 = uStack_1570;
      uVar9 = uStack_15f0;
      local_1608 = local_1588;
      uVar7 = local_1608;
      uStack_1600 = uStack_1580;
      uVar8 = uStack_1600;
      local_1618 = local_1598;
      uVar16 = local_1618;
      uStack_1610 = uStack_1590;
      uVar13 = uStack_1610;
      uStack_1620 = uStack_15a0;
      uVar15 = uStack_1620;
      uStack_1620._0_4_ = (undefined4)uStack_15a0;
      uStack_1620._4_4_ = (undefined4)((ulong)uStack_15a0 >> 0x20);
      local_1618._0_4_ = (undefined4)local_1598;
      local_1618._4_4_ = (undefined4)((ulong)local_1598 >> 0x20);
      uStack_1610._0_4_ = (int)uStack_1590;
      uStack_1610._4_4_ = (llama_token)((ulong)uStack_1590 >> 0x20);
      local_1608._0_4_ = (llama_pos)local_1588;
      uStack_1600._0_4_ = (undefined4)uStack_1580;
      uStack_1600._4_4_ = (undefined4)((ulong)uStack_1580 >> 0x20);
      uStack_15f0._0_4_ = (undefined4)uStack_1570;
      uStack_15f0._4_4_ = (undefined4)((ulong)uStack_1570 >> 0x20);
      uVar23 = (undefined2)((ulong)local_1588 >> 0x20);
      parse_special = (undefined1)((ulong)local_1588 >> 0x30);
      add_special = (undefined1)((ulong)local_1588 >> 0x38);
      uStack_18d0 = (undefined4)uStack_1620;
      uStack_18cc = uStack_1620._4_4_;
      uVar21 = (undefined4)local_1618;
      uStack_1884 = local_1618._4_4_;
      iStack_18c0 = (int)uStack_1610;
      lStack_18bc = uStack_1610._4_4_;
      local_1878 = (llama_pos)local_1608;
      uStack_1870 = (undefined4)uStack_1600;
      uStack_186c = uStack_1600._4_4_;
      uVar22 = (undefined4)uStack_15f0;
      uVar24 = uStack_15f0._4_4_;
      uStack_1620 = uVar15;
      local_1618 = uVar16;
      uStack_1610 = uVar13;
      local_1608 = uVar7;
      uStack_1600 = uVar8;
      uStack_15f0 = uVar9;
      local_15b0 = llama_init_from_model(local_14e0);
      if (local_15b0 == 0) {
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          common_log_add(pcVar14,GGML_LOG_LEVEL_ERROR,"%s: failed to create the llama_context\n",
                         "main");
        }
        local_4 = 1;
        local_1368 = 1;
      }
      else {
        local_1639 = llama_sampler_chain_default_params();
        local_1629 = local_1639;
        uVar15 = llama_sampler_chain_init(local_1639);
        local_1638 = uVar15;
        uVar16 = llama_sampler_init_greedy();
        llama_sampler_chain_add(uVar15,uVar16);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x1779c6);
        common_tokenize(local_1578,(string *)CONCAT44(uStack_186c,uStack_1870),(bool)add_special,
                        (bool)parse_special);
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_18bc,iStack_18c0),
                   (vector<int,_std::allocator<int>_> *)CONCAT44(uStack_1884,uVar21));
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_18bc,iStack_18c0));
        common_tokenize(local_1578,(string *)CONCAT44(uStack_186c,uStack_1870),(bool)add_special,
                        (bool)parse_special);
        sVar17 = std::vector<int,_std::allocator<int>_>::size(&local_1690);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_18bc,iStack_18c0));
        local_1674 = (uint)sVar17;
        sVar17 = std::vector<int,_std::allocator<int>_>::size(&local_1658);
        local_1694 = (uint)sVar17;
        local_1698 = 0x10;
        local_169c = local_1694 + 0x10;
        iVar12 = llama_n_ctx(local_15b0);
        local_16a0 = iVar12 - local_1370;
        local_16a4 = llama_n_ctx(local_15b0);
        local_16a8 = uStack_15a4;
        local_16ac = uStack_15a4 / local_1374;
        __a = local_1578;
        piVar25 = local_1568;
        sVar17 = sStack_1560;
        if ((uint)common_log_verbosity_thold < 0x80000000) {
          pcVar14 = common_log_main();
          iStack_18c0 = local_136c;
          local_1878 = local_1378;
          common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,
                         "\n%s: n_len = %d, n_ctx = %d, n_kv_req = %d, n_grp = %d, n_batch = %d, n_junk = %d, i_pos = %d\n"
                         ,"main",(ulong)local_169c,(ulong)local_16a0);
          __a = local_1578;
          piVar25 = local_1568;
          sVar17 = sStack_1560;
        }
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"\n");
        }
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"prefix tokens: %d\n",(ulong)local_1674);
        }
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"prompt tokens: %d\n",(ulong)local_1694);
        }
        llama_batch_init(&local_16e8,local_1350,0,1);
        local_16ec = 0;
        for (local_16f0 = 0; (int)local_16f0 < (int)local_16a0; local_16f0 = local_16a8 + local_16f0
            ) {
          if ((0 < (int)local_16f0) && (1 < (int)local_1374)) {
            local_16f4 = (int)local_16f0 / (int)local_16a8 + -1;
            local_16f8 = local_16ac * (local_1374 - 1);
            llama_kv_self_seq_add
                      (local_15b0,0,local_16ec - local_16a8,local_16ec,local_16f4 * local_16f8);
            llama_kv_self_seq_div
                      (local_15b0,0,(local_16ec - local_16a8) + local_16f4 * local_16f8,
                       local_16ec + local_16f4 * local_16f8,local_1374);
            llama_kv_self_update(local_15b0);
            local_16ec = llama_kv_self_seq_pos_max(local_15b0);
            local_16ec = local_16ec + 1;
          }
          common_batch_clear(&local_16e8);
          for (local_16fc = 0;
              local_16fc < (int)local_16a8 && (int)(local_16f0 + local_16fc) < (int)local_1694;
              local_16fc = local_16fc + 1) {
            std::vector<int,_std::allocator<int>_>::operator[]
                      (&local_1658,(long)(int)(local_16f0 + local_16fc));
            local_16ec = local_16ec + 1;
            local_172c = 0;
            local_1728 = &local_172c;
            local_1720 = 1;
            std::allocator<int>::allocator((allocator<int> *)0x177eba);
            __l._M_len = sVar17;
            __l._M_array = piVar25;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar24,uVar22),__l,
                       (allocator_type *)__a);
            common_batch_add((llama_batch *)CONCAT44(uStack_186c,uStack_1870),
                             CONCAT13(add_special,CONCAT12(parse_special,uVar23)),local_1878,
                             (vector<int,_std::allocator<int>_> *)CONCAT44(lStack_18bc,iStack_18c0),
                             SUB41((uint)uStack_1884 >> 0x18,0));
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_18bc,iStack_18c0));
            std::allocator<int>::~allocator((allocator<int> *)0x177f23);
          }
          if ((int)local_1694 <= (int)(local_16f0 + local_16a8)) {
            *(llama_context *)(local_16e8.logits + (local_16e8.n_tokens + -1)) = (llama_context)0x1;
          }
          local_1738 = (llama_context *)local_16e8.logits;
          local_1748 = local_16e8.n_seq_id;
          piVar4 = local_1748;
          uStack_1740 = local_16e8.seq_id;
          pplVar5 = uStack_1740;
          local_1758 = local_16e8.embd;
          pfVar2 = local_1758;
          uStack_1750 = local_16e8.pos;
          plVar3 = uStack_1750;
          uStack_1760 = local_16e8.token;
          plVar1 = uStack_1760;
          uStack_1760._0_4_ = SUB84(local_16e8.token,0);
          uStack_1760._4_4_ = (undefined4)((ulong)local_16e8.token >> 0x20);
          local_1758._4_4_ = (undefined4)((ulong)local_16e8.embd >> 0x20);
          uStack_1750._0_4_ = (int)local_16e8.pos;
          uStack_1750._4_4_ = (llama_token)((ulong)local_16e8.pos >> 0x20);
          local_1748._0_4_ = (llama_pos)local_16e8.n_seq_id;
          uStack_1740._0_4_ = SUB84(local_16e8.seq_id,0);
          uStack_1740._4_4_ = (undefined4)((ulong)local_16e8.seq_id >> 0x20);
          uVar23 = (undefined2)((ulong)local_16e8.n_seq_id >> 0x20);
          parse_special = (undefined1)((ulong)local_16e8.n_seq_id >> 0x30);
          add_special = (undefined1)((ulong)local_16e8.n_seq_id >> 0x38);
          uStack_18d0 = (undefined4)uStack_1760;
          uStack_18cc = uStack_1760._4_4_;
          uStack_1884 = local_1758._4_4_;
          iStack_18c0 = (int)uStack_1750;
          lStack_18bc = uStack_1750._4_4_;
          local_1878 = (llama_pos)local_1748;
          uStack_1870 = (undefined4)uStack_1740;
          uStack_186c = uStack_1740._4_4_;
          __a = (llama_context *)local_16e8.logits;
          uStack_1760 = plVar1;
          local_1758 = pfVar2;
          uStack_1750 = plVar3;
          local_1748 = piVar4;
          uStack_1740 = pplVar5;
          iVar12 = llama_decode(local_15b0);
          if (iVar12 != 0) {
            if (-1 < common_log_verbosity_thold) {
              pcVar14 = common_log_main();
              common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"%s: llama_decode() failed\n","main");
            }
            local_4 = 1;
            goto LAB_00178e6e;
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar14 = common_log_main();
            uVar6 = local_16f0;
            local_176c[0] = local_16f0 + local_16a8;
            puVar18 = (uint *)std::min<int>(local_176c,(int *)&local_1694);
            common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"%s: processed: [%6d, %6d)\n","main",
                           (ulong)uVar6,(ulong)*puVar18);
          }
          if ((int)local_1694 <= (int)(local_16f0 + local_16a8)) break;
        }
        for (local_1770 = local_16a0; (int)local_1770 < (int)local_1694;
            local_1770 = local_16a8 + local_1770) {
          local_1774 = local_16a8;
          if (-1 < common_log_verbosity_thold) {
            pcVar14 = common_log_main();
            common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"%s: shifting KV cache with %d\n","main",
                           (ulong)local_1774);
          }
          llama_kv_self_seq_rm(local_15b0,0,local_1370,local_1370 + local_1774);
          llama_kv_self_seq_add(local_15b0,0,local_1370 + local_1774,local_16a0,-local_1774);
          llama_kv_self_update(local_15b0);
          local_16ec = llama_kv_self_seq_pos_max(local_15b0);
          local_16ec = local_16ec + 1;
          common_batch_clear(&local_16e8);
          for (local_1778 = 0;
              local_1778 < (int)local_16a8 && (int)(local_1770 + local_1778) < (int)local_1694;
              local_1778 = local_1778 + 1) {
            std::vector<int,_std::allocator<int>_>::operator[]
                      (&local_1658,(long)(int)(local_1770 + local_1778));
            local_16ec = local_16ec + 1;
            local_17a4 = 0;
            local_17a0 = &local_17a4;
            local_1798 = 1;
            std::allocator<int>::allocator((allocator<int> *)0x17835d);
            __l_00._M_len = sVar17;
            __l_00._M_array = piVar25;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar24,uVar22),__l_00,
                       (allocator_type *)__a);
            common_batch_add((llama_batch *)CONCAT44(uStack_186c,uStack_1870),
                             CONCAT13(add_special,CONCAT12(parse_special,uVar23)),local_1878,
                             (vector<int,_std::allocator<int>_> *)CONCAT44(lStack_18bc,iStack_18c0),
                             SUB41((uint)uStack_1884 >> 0x18,0));
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_18bc,iStack_18c0));
            std::allocator<int>::~allocator((allocator<int> *)0x1783c6);
          }
          if ((int)local_1694 <= (int)(local_1770 + local_16a8)) {
            *(llama_context *)(local_16e8.logits + (local_16e8.n_tokens + -1)) = (llama_context)0x1;
          }
          local_17b8 = (llama_context *)local_16e8.logits;
          local_17c8 = local_16e8.n_seq_id;
          piVar4 = local_17c8;
          uStack_17c0 = local_16e8.seq_id;
          pplVar5 = uStack_17c0;
          local_17d8 = local_16e8.embd;
          pfVar2 = local_17d8;
          uStack_17d0 = local_16e8.pos;
          plVar3 = uStack_17d0;
          uStack_17e0 = local_16e8.token;
          plVar1 = uStack_17e0;
          uStack_17e0._0_4_ = SUB84(local_16e8.token,0);
          uStack_17e0._4_4_ = (undefined4)((ulong)local_16e8.token >> 0x20);
          local_17d8._4_4_ = (undefined4)((ulong)local_16e8.embd >> 0x20);
          uStack_17d0._0_4_ = (int)local_16e8.pos;
          uStack_17d0._4_4_ = (llama_token)((ulong)local_16e8.pos >> 0x20);
          local_17c8._0_4_ = (llama_pos)local_16e8.n_seq_id;
          uStack_17c0._0_4_ = SUB84(local_16e8.seq_id,0);
          uStack_17c0._4_4_ = (undefined4)((ulong)local_16e8.seq_id >> 0x20);
          uVar23 = (undefined2)((ulong)local_16e8.n_seq_id >> 0x20);
          parse_special = (undefined1)((ulong)local_16e8.n_seq_id >> 0x30);
          add_special = (undefined1)((ulong)local_16e8.n_seq_id >> 0x38);
          uStack_18d0 = (undefined4)uStack_17e0;
          uStack_18cc = uStack_17e0._4_4_;
          uStack_1884 = local_17d8._4_4_;
          iStack_18c0 = (int)uStack_17d0;
          lStack_18bc = uStack_17d0._4_4_;
          local_1878 = (llama_pos)local_17c8;
          uStack_1870 = (undefined4)uStack_17c0;
          uStack_186c = uStack_17c0._4_4_;
          __a = (llama_context *)local_16e8.logits;
          uStack_17e0 = plVar1;
          local_17d8 = pfVar2;
          uStack_17d0 = plVar3;
          local_17c8 = piVar4;
          uStack_17c0 = pplVar5;
          iVar12 = llama_decode(local_15b0);
          if (iVar12 != 0) {
            if (-1 < common_log_verbosity_thold) {
              pcVar14 = common_log_main();
              common_log_add(pcVar14,GGML_LOG_LEVEL_ERROR,"%s: llama_decode() failed\n","main");
            }
            local_4 = 1;
            goto LAB_00178e6e;
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar14 = common_log_main();
            uVar6 = local_1770;
            local_17ec[0] = local_1770 + local_16a8;
            puVar18 = (uint *)std::min<int>(local_17ec,(int *)&local_1694);
            common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"%s: processed: [%6d, %6d)\n","main",
                           (ulong)uVar6,(ulong)*puVar18);
          }
        }
        local_17f0 = (local_16ec - local_16a0) + 0x10;
        iStack_1880 = iStack_18c0;
        lStack_187c = lStack_18bc;
        if (0 < (int)local_17f0) {
          if (-1 < common_log_verbosity_thold) {
            pcVar14 = common_log_main();
            common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,
                           "%s: shifting KV cache with %d to free space for the answer\n","main",
                           (ulong)local_17f0);
            iStack_1880 = iStack_18c0;
            lStack_187c = lStack_18bc;
          }
          llama_kv_self_seq_rm(local_15b0,0,local_1370,local_1370 + local_17f0);
          llama_kv_self_seq_add(local_15b0,0,local_1370 + local_17f0,local_16a0,-local_17f0);
          llama_kv_self_update(local_15b0);
          local_16ec = llama_kv_self_seq_pos_max(local_15b0,0);
          local_16ec = local_16ec + 1;
        }
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"\n");
        }
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,
                         "%s: passkey = %d, inserted at position %d / %d (token pos: ~%d)\n","main",
                         (ulong)local_13c8);
        }
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"\n");
        }
        local_17f4 = local_1694;
        local_17f8 = 0;
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          uVar15 = std::__cxx11::string::c_str();
          common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"%s",uVar15);
        }
        local_1800 = ggml_time_us();
        do {
          logits = (undefined1)((uint)uStack_1884 >> 0x18);
          if ((int)local_169c < (int)local_17f4) {
LAB_00178c43:
            if (-1 < common_log_verbosity_thold) {
              pcVar14 = common_log_main();
              common_log_add(pcVar14,GGML_LOG_LEVEL_NONE,"\n");
            }
            lVar19 = ggml_time_us();
            if (-1 < common_log_verbosity_thold) {
              pcVar14 = common_log_main();
              fVar20 = (float)(lVar19 - local_1800) / 1e+06;
              common_log_add(SUB84((double)fVar20,0),SUB84((double)((float)local_17f8 / fVar20),0),
                             (char *)pcVar14,2,"%s: decoded %d tokens in %.2f s, speed: %.2f t/s\n",
                             "main");
            }
            if (-1 < common_log_verbosity_thold) {
              pcVar14 = common_log_main();
              common_log_add(pcVar14,GGML_LOG_LEVEL_NONE,"\n");
            }
            llama_perf_context_print(local_15b0);
            if (-1 < common_log_verbosity_thold) {
              pcVar14 = common_log_main();
              common_log_add(pcVar14,GGML_LOG_LEVEL_NONE,"\n");
            }
            llama_sampler_free(local_1638);
            uStack_18d0 = SUB84(local_16e8.token,0);
            uStack_18cc = (undefined4)((ulong)local_16e8.token >> 0x20);
            iStack_18c0 = (int)local_16e8.pos;
            lStack_18bc = (llama_token)((ulong)local_16e8.pos >> 0x20);
            llama_batch_free();
            llama_free(local_15b0);
            llama_model_free(local_14e0);
            llama_backend_free();
            local_4 = 0;
            goto LAB_00178e6e;
          }
          local_1804 = llama_sampler_sample(local_1638,local_15b0,local_16e8.n_tokens + -1);
          bVar11 = llama_vocab_is_eog(local_1530,local_1804);
          if (((bVar11 & 1) != 0) || (local_17f4 == local_169c)) {
            if (-1 < common_log_verbosity_thold) {
              pcVar14 = common_log_main();
              common_log_add(pcVar14,GGML_LOG_LEVEL_NONE,"\n");
            }
            goto LAB_00178c43;
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar14 = common_log_main();
            common_token_to_piece_abi_cxx11_
                      ((llama_context *)
                       CONCAT17(add_special,CONCAT16(parse_special,CONCAT24(uVar23,local_1878))),
                       lStack_187c,SUB41((uint)iStack_1880 >> 0x18,0));
            uVar15 = std::__cxx11::string::c_str();
            common_log_add(pcVar14,GGML_LOG_LEVEL_NONE,"%s",uVar15);
            std::__cxx11::string::~string(local_1828);
          }
          local_17f8 = local_17f8 + 1;
          common_batch_clear(&local_16e8);
          local_16ec = local_16ec + 1;
          local_1854 = 0;
          local_1850 = &local_1854;
          local_1848 = 1;
          std::allocator<int>::allocator((allocator<int> *)0x178a74);
          __l_01._M_len = sVar17;
          __l_01._M_array = piVar25;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar24,uVar22),__l_01,
                     (allocator_type *)__a);
          common_batch_add((llama_batch *)CONCAT44(uStack_186c,uStack_1870),
                           CONCAT13(add_special,CONCAT12(parse_special,uVar23)),local_1878,
                           (vector<int,_std::allocator<int>_> *)CONCAT44(lStack_187c,iStack_1880),
                           (bool)logits);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_187c,iStack_1880));
          std::allocator<int>::~allocator((allocator<int> *)0x178ae0);
          local_17f4 = local_17f4 + 1;
          uStack_1890 = SUB84(local_16e8.token,0);
          uStack_188c = (undefined4)((ulong)local_16e8.token >> 0x20);
          uStack_1884 = (undefined4)((ulong)local_16e8.embd >> 0x20);
          iStack_1880 = (int)local_16e8.pos;
          lStack_187c = (llama_token)((ulong)local_16e8.pos >> 0x20);
          local_1878 = (llama_pos)local_16e8.n_seq_id;
          uStack_1870 = SUB84(local_16e8.seq_id,0);
          uStack_186c = (undefined4)((ulong)local_16e8.seq_id >> 0x20);
          uVar23 = (undefined2)((ulong)local_16e8.n_seq_id >> 0x20);
          parse_special = (undefined1)((ulong)local_16e8.n_seq_id >> 0x30);
          add_special = (undefined1)((ulong)local_16e8.n_seq_id >> 0x38);
          __a = (llama_context *)local_16e8.logits;
          iVar12 = llama_decode(local_15b0);
        } while (iVar12 == 0);
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          common_log_add(pcVar14,GGML_LOG_LEVEL_ERROR,"%s : failed to eval, return code %d\n","main"
                         ,1);
        }
        local_4 = 1;
        uStack_18d0 = uStack_1890;
        uStack_18cc = uStack_188c;
        iStack_18c0 = iStack_1880;
        lStack_18bc = lStack_187c;
LAB_00178e6e:
        local_1368 = 1;
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_18bc,iStack_18c0));
      }
    }
    std::__cxx11::string::~string(local_13c0);
    std::__cxx11::string::~string(local_1398);
    in_stack_ffffffffffffe4e0 = uStack_18d0;
    in_stack_ffffffffffffe4e4 = uStack_18cc;
  }
  else {
    local_4 = 1;
    local_1368 = 1;
  }
  common_params::~common_params
            ((common_params *)CONCAT44(in_stack_ffffffffffffe4e4,in_stack_ffffffffffffe4e0));
  return local_4;
}

Assistant:

int main(int argc, char ** argv) {
    common_params params;

    params.n_junk = 250;
    params.n_keep = 32;
    params.i_pos  = -1;

    if (!common_params_parse(argc, argv, params, LLAMA_EXAMPLE_PASSKEY, print_usage)) {
        return 1;
    }

    common_init();

    int n_junk = params.n_junk;
    int n_keep = params.n_keep;
    int n_grp  = params.grp_attn_n;
    int i_pos  = params.i_pos;

    if (i_pos == -1) {
        i_pos = rand() % n_junk;
    }

    const std::string prompt_prefix = "There is an important info hidden inside a lot of irrelevant text. Find it and memorize them. I will quiz you about the important information there.";
    const std::string prompt_suffix = " What is the pass key? The pass key is";

    // generate junk text
    params.prompt = prompt_prefix;

    const int passkey = rand() % 50000 + 1;

    for (int i = 0; i < n_junk; i++) {
        if (i % n_junk == i_pos) {
            params.prompt += " The pass key is " + std::to_string(passkey) + ". Remember it. " + std::to_string(passkey) + " is the pass key.";
        }

        params.prompt += " The grass is green. The sky is blue. The sun is yellow. Here we go. There and back again.";
    }

    params.prompt += prompt_suffix;

    // init LLM

    llama_backend_init();
    llama_numa_init(params.numa);

    // initialize the model

    llama_model_params model_params = common_model_params_to_llama(params);

    llama_model * model = llama_model_load_from_file(params.model.path.c_str(), model_params);

    if (model == NULL) {
        LOG_ERR("%s: unable to load model\n" , __func__);
        return 1;
    }

    const llama_vocab * vocab = llama_model_get_vocab(model);

    // initialize the context

    llama_context_params ctx_params = common_context_params_to_llama(params);

    ctx_params.n_ctx = llama_model_n_ctx_train(model)*n_grp + n_keep;

    GGML_ASSERT(ctx_params.n_batch % n_grp == 0 && "n_batch must be divisible by n_grp");

    llama_context * ctx = llama_init_from_model(model, ctx_params);
    if (ctx == NULL) {
        LOG_ERR("%s: failed to create the llama_context\n" , __func__);
        return 1;
    }

    auto sparams = llama_sampler_chain_default_params();

    llama_sampler * smpl = llama_sampler_chain_init(sparams);

    llama_sampler_chain_add(smpl, llama_sampler_init_greedy());

    // tokenize the prompt
    std::vector<llama_token> tokens_list;
    tokens_list = common_tokenize(ctx, params.prompt, true);

    // tokenize the prefix and use it as a sink
    const int n_tokens_prefix = common_tokenize(ctx, prompt_prefix, true).size();

    const int n_tokens_all = tokens_list.size();

    // we leave a margin of 16 tokens for the generated text - it should contain just the passkey
    const int n_predict = 16;

    // total length of the sequences including the prompt
    const int n_len = n_tokens_all + n_predict;

    const int n_ctx       = llama_n_ctx(ctx) - n_keep;
    const int n_kv_req    = llama_n_ctx(ctx);
    const int n_batch     = ctx_params.n_batch;
    const int n_batch_grp = ctx_params.n_batch/n_grp;

    LOG_INF("\n%s: n_len = %d, n_ctx = %d, n_kv_req = %d, n_grp = %d, n_batch = %d, n_junk = %d, i_pos = %d\n", __func__, n_len, n_ctx, n_kv_req, n_grp, n_batch, n_junk, i_pos);

    // print the prompt token-by-token

    LOG_INF("\n");
    LOG_INF("prefix tokens: %d\n", n_tokens_prefix);
    LOG_INF("prompt tokens: %d\n", n_tokens_all);
    //LOG_INF("prompt: %s\n", params.prompt.c_str());

    llama_batch batch = llama_batch_init(params.n_batch, 0, 1);

    int n_past = 0;

    // fill the KV cache
    for (int i = 0; i < n_ctx; i += n_batch) {
        if (i > 0 && n_grp > 1) {
            // if SelfExtend is enabled, we compress the position from the last batch by a factor of n_grp
            const int ib = i/n_batch - 1;
            const int bd = n_batch_grp*(n_grp - 1);

            llama_kv_self_seq_add (ctx, 0, n_past - n_batch,         n_past,         ib*bd);
            llama_kv_self_seq_div (ctx, 0, n_past - n_batch + ib*bd, n_past + ib*bd, n_grp);
            llama_kv_self_update  (ctx);

            n_past = llama_kv_self_seq_pos_max(ctx, 0) + 1;
        }

        common_batch_clear(batch);

        for (int j = 0; j < n_batch && i + j < n_tokens_all; j++) {
            common_batch_add(batch, tokens_list[i + j], n_past++, { 0 }, false);
        }

        if (i + n_batch >= n_tokens_all) {
            batch.logits[batch.n_tokens - 1] = true;
        }

        if (llama_decode(ctx, batch) != 0) {
            LOG_INF("%s: llama_decode() failed\n", __func__);
            return 1;
        }

        LOG_INF("%s: processed: [%6d, %6d)\n", __func__, i, std::min(i + n_batch, n_tokens_all));

        if (i + n_batch >= n_tokens_all) {
            break;
        }
    }

    for (int i = n_ctx; i < n_tokens_all; i += n_batch) {
        const int n_discard = n_batch;

        LOG_INF("%s: shifting KV cache with %d\n", __func__, n_discard);

        llama_kv_self_seq_rm (ctx, 0, n_keep            , n_keep + n_discard);
        llama_kv_self_seq_add(ctx, 0, n_keep + n_discard, n_ctx,  -n_discard);
      //llama_kv_self_defrag (ctx);
        llama_kv_self_update (ctx);

        n_past = llama_kv_self_seq_pos_max(ctx, 0) + 1;

        common_batch_clear(batch);

        for (int j = 0; j < n_batch && i + j < n_tokens_all; j++) {
            common_batch_add(batch, tokens_list[i + j], n_past++, { 0 }, false);
        }

        if (i + n_batch >= n_tokens_all) {
            batch.logits[batch.n_tokens - 1] = true;
        }

        if (llama_decode(ctx, batch) != 0) {
            LOG_ERR("%s: llama_decode() failed\n", __func__);
            return 1;
        }

        LOG_INF("%s: processed: [%6d, %6d)\n", __func__, i, std::min(i + n_batch, n_tokens_all));
    }

    {
        const int n_discard = n_past - n_ctx + n_predict;

        if (n_discard > 0) {
            LOG_INF("%s: shifting KV cache with %d to free space for the answer\n", __func__, n_discard);

            llama_kv_self_seq_rm (ctx, 0, n_keep            , n_keep + n_discard);
            llama_kv_self_seq_add(ctx, 0, n_keep + n_discard, n_ctx,  -n_discard);
          //llama_kv_self_defrag (ctx);
            llama_kv_self_update (ctx);

            n_past = llama_kv_self_seq_pos_max(ctx, 0) + 1;
        }
    }

    LOG_INF("\n");
    LOG_INF("%s: passkey = %d, inserted at position %d / %d (token pos: ~%d)\n", __func__, passkey, i_pos, n_junk, (i_pos * n_tokens_all) / n_junk);
    LOG_INF("\n");

    // main loop

    int n_cur    = n_tokens_all;
    int n_decode = 0;

    LOG_INF("%s", prompt_suffix.c_str());

    const auto t_main_start = ggml_time_us();

    while (n_cur <= n_len) {
        // sample the next token
        {
            const llama_token new_token_id = llama_sampler_sample(smpl, ctx, batch.n_tokens - 1);

            // is it an end of generation?
            if (llama_vocab_is_eog(vocab, new_token_id) || n_cur == n_len) {
                LOG("\n");

                break;
            }

            LOG("%s", common_token_to_piece(ctx, new_token_id).c_str());

            n_decode += 1;

            // prepare the next batch
            common_batch_clear(batch);

            // push this new token for next evaluation
            common_batch_add(batch, new_token_id, n_past++, { 0 }, true);
        }

        n_cur += 1;

        // evaluate the current batch with the transformer model
        if (llama_decode(ctx, batch)) {
            LOG_ERR("%s : failed to eval, return code %d\n", __func__, 1);
            return 1;
        }
    }

    LOG("\n");

    const auto t_main_end = ggml_time_us();

    LOG_INF("%s: decoded %d tokens in %.2f s, speed: %.2f t/s\n",
            __func__, n_decode, (t_main_end - t_main_start) / 1000000.0f, n_decode / ((t_main_end - t_main_start) / 1000000.0f));

    LOG("\n");
    llama_perf_context_print(ctx);

    LOG("\n");

    llama_sampler_free(smpl);

    llama_batch_free(batch);

    llama_free(ctx);
    llama_model_free(model);

    llama_backend_free();

    return 0;
}